

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DocumentContext.cpp
# Opt level: O0

EStatusCode __thiscall
PDFHummus::DocumentContext::WriteFormForImage
          (DocumentContext *this,string *inImagePath,unsigned_long inImageIndex,
          ObjectIDType inObjectID,PDFParsingOptions *inParsingOptions)

{
  unsigned_long inPDFFilePath;
  EStatusCode EVar1;
  IByteReaderWithPosition *inPNGStream;
  PDFFormXObject *pPVar2;
  PDFFormXObject *form_2;
  undefined1 local_138 [8];
  InputFile inputFile;
  PDFFormXObject *form_1;
  TIFFUsageParameters params;
  PDFFormXObject *form;
  list<unsigned_long,_std::allocator<unsigned_long>_> local_d0;
  list<unsigned_long,_std::allocator<unsigned_long>_> local_b8;
  EStatusCodeAndObjectIDTypeList local_98;
  pair<unsigned_long,_unsigned_long> local_68;
  undefined1 local_58 [8];
  PDFPageRange singlePageRange;
  EHummusImageType imageType;
  EStatusCode status;
  PDFParsingOptions *inParsingOptions_local;
  ObjectIDType inObjectID_local;
  unsigned_long inImageIndex_local;
  string *inImagePath_local;
  DocumentContext *this_local;
  
  singlePageRange.mSpecificRanges.
  super__List_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl._M_node._M_size._4_4_ = eFailure;
  inParsingOptions_local = (PDFParsingOptions *)inObjectID;
  inObjectID_local = inImageIndex;
  inImageIndex_local = (unsigned_long)inImagePath;
  inImagePath_local = (string *)this;
  singlePageRange.mSpecificRanges.
  super__List_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl._M_node._M_size._0_4_ = GetImageType(this,inImagePath,inImageIndex);
  switch((EHummusImageType)
         singlePageRange.mSpecificRanges.
         super__List_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
         ._M_impl._M_node._M_size) {
  case ePDF:
    PDFPageRange::PDFPageRange((PDFPageRange *)local_58);
    local_58._0_4_ = eRangeTypeSpecific;
    std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long_&,_unsigned_long_&,_true>
              (&local_68,&inObjectID_local,&inObjectID_local);
    std::__cxx11::
    list<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::push_back((list<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 *)&singlePageRange,&local_68);
    inPDFFilePath = inImageIndex_local;
    local_b8.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node.
    super__List_node_base._M_next = (_List_node_base *)0x0;
    local_b8.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node.
    super__List_node_base._M_prev = (_List_node_base *)0x0;
    local_b8.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node._M_size
         = 0;
    std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::list(&local_b8);
    std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)((long)&form + 7));
    std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::list
              (&local_d0,1,(value_type_conflict *)&inParsingOptions_local,
               (allocator<unsigned_long> *)((long)&form + 7));
    CreateFormXObjectsFromPDF
              (&local_98,this,(string *)inPDFFilePath,inParsingOptions,(PDFPageRange *)local_58,
               ePDFPageBoxMediaBox,(double *)0x0,&local_b8,&local_d0);
    singlePageRange.mSpecificRanges.
    super__List_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ._M_impl._M_node._M_size._4_4_ = local_98.first;
    std::
    pair<PDFHummus::EStatusCode,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::~pair(&local_98);
    std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::~list(&local_d0);
    std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)((long)&form + 7));
    std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::~list(&local_b8);
    PDFPageRange::~PDFPageRange((PDFPageRange *)local_58);
    break;
  case eJPG:
    pPVar2 = CreateFormXObjectFromJPGFile
                       (this,(string *)inImageIndex_local,(ObjectIDType)inParsingOptions_local);
    singlePageRange.mSpecificRanges.
    super__List_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ._M_impl._M_node._M_size._4_4_ = eFailure;
    if (pPVar2 != (PDFFormXObject *)0x0) {
      singlePageRange.mSpecificRanges.
      super__List_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl._M_node._M_size._4_4_ = eSuccess;
      params._24_8_ = pPVar2;
      PDFFormXObject::~PDFFormXObject(pPVar2);
      operator_delete(pPVar2,0x1f0);
    }
    break;
  case eTIFF:
    TIFFUsageParameters::TIFFUsageParameters((TIFFUsageParameters *)&form_1);
    form_1._0_4_ = (undefined4)inObjectID_local;
    pPVar2 = CreateFormXObjectFromTIFFFile
                       (this,(string *)inImageIndex_local,(ObjectIDType)inParsingOptions_local,
                        (TIFFUsageParameters *)&form_1);
    singlePageRange.mSpecificRanges.
    super__List_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ._M_impl._M_node._M_size._4_4_ = eFailure;
    inputFile.mFileStream = (InputFileStream *)pPVar2;
    if (pPVar2 != (PDFFormXObject *)0x0) {
      singlePageRange.mSpecificRanges.
      super__List_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl._M_node._M_size._4_4_ = eSuccess;
      PDFFormXObject::~PDFFormXObject(pPVar2);
      operator_delete(pPVar2,0x1f0);
    }
    TIFFUsageParameters::~TIFFUsageParameters((TIFFUsageParameters *)&form_1);
    break;
  case ePNG:
    InputFile::InputFile((InputFile *)local_138);
    EVar1 = InputFile::OpenFile((InputFile *)local_138,(string *)inImageIndex_local);
    if (EVar1 == eSuccess) {
      inPNGStream = InputFile::GetInputStream((InputFile *)local_138);
      pPVar2 = CreateFormXObjectFromPNGStream(this,inPNGStream,(ObjectIDType)inParsingOptions_local)
      ;
      singlePageRange.mSpecificRanges.
      super__List_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl._M_node._M_size._4_4_ = eFailure;
      if (pPVar2 != (PDFFormXObject *)0x0) {
        singlePageRange.mSpecificRanges.
        super__List_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ._M_impl._M_node._M_size._4_4_ = eSuccess;
        PDFFormXObject::~PDFFormXObject(pPVar2);
        operator_delete(pPVar2,0x1f0);
      }
    }
    InputFile::~InputFile((InputFile *)local_138);
    break;
  default:
    singlePageRange.mSpecificRanges.
    super__List_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ._M_impl._M_node._M_size._4_4_ = eFailure;
  }
  return singlePageRange.mSpecificRanges.
         super__List_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
         ._M_impl._M_node._M_size._4_4_;
}

Assistant:

EStatusCode DocumentContext::WriteFormForImage(
	const std::string& inImagePath,
	unsigned long inImageIndex,
	ObjectIDType inObjectID,
	const PDFParsingOptions& inParsingOptions)
{
    EStatusCode status = eFailure;
    EHummusImageType imageType = GetImageType(inImagePath,inImageIndex);

    switch(imageType)
    {
        case ePDF:
        {
			PDFPageRange singlePageRange;
			singlePageRange.mType = PDFPageRange::eRangeTypeSpecific;
			singlePageRange.mSpecificRanges.push_back(ULongAndULong(inImageIndex, inImageIndex));

			status = CreateFormXObjectsFromPDF(inImagePath, inParsingOptions, singlePageRange, ePDFPageBoxMediaBox, NULL, ObjectIDTypeList(), ObjectIDTypeList(1, inObjectID)).first;
            break;
        }
        case eJPG:
        {
            PDFFormXObject* form = CreateFormXObjectFromJPGFile(inImagePath,inObjectID);
            status = (form ? eSuccess:eFailure);
            delete form;
            break;
        }
#ifndef PDFHUMMUS_NO_TIFF
		case eTIFF:
        {
            TIFFUsageParameters params;
            params.PageIndex = (unsigned int)inImageIndex;

            PDFFormXObject* form = CreateFormXObjectFromTIFFFile(inImagePath,inObjectID,params);
            status = (form ? eSuccess:eFailure);
            delete form;
            break;
        }
#endif
#ifndef PDFHUMMUS_NO_PNG
		case ePNG:
		{
			InputFile inputFile;
			if (inputFile.OpenFile(inImagePath) != eSuccess) {
				break;
			}
			PDFFormXObject* form = CreateFormXObjectFromPNGStream(inputFile.GetInputStream(), inObjectID);
			status = (form ? eSuccess : eFailure);
			delete form;
			break;
		}

		default:
        {
            status = eFailure;
        }
#endif
	}
    return status;
}